

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedCommand(SelectionEvaluator *this,Token *token)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::any_cast<std::__cxx11::string>(&local_30,&token->value);
  std::operator+(&local_50,"unrecognized command:",&local_30);
  evalError(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void unrecognizedCommand(const Token& token) {
      evalError("unrecognized command:" +
                std::any_cast<std::string>(token.value));
    }